

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::
list_caster<std::vector<NodePosition,_std::allocator<NodePosition>_>,_NodePosition>::load
          (list_caster<std::vector<NodePosition,_std::allocator<NodePosition>_>,_NodePosition> *this
          ,handle src,bool convert)

{
  bool bVar1;
  undefined1 uVar2;
  It *in_RDI;
  sequence_slow_readwrite sVar3;
  value_conv conv;
  reference it;
  sequence_iterator __end3;
  sequence_iterator __begin3;
  sequence *__range3;
  sequence s;
  It *in_stack_fffffffffffffee8;
  handle in_stack_fffffffffffffef0;
  undefined5 in_stack_fffffffffffffef8;
  byte in_stack_fffffffffffffefd;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  list_caster<std::vector<NodePosition,_std::allocator<NodePosition>_>,_NodePosition>
  *in_stack_ffffffffffffff00;
  handle hVar4;
  handle local_f8;
  byte local_1;
  
  bVar1 = isinstance<pybind11::sequence,_0>(in_stack_fffffffffffffef0);
  if ((!bVar1) || (bVar1 = isinstance<pybind11::str,_0>(in_stack_fffffffffffffef0), bVar1)) {
    local_1 = 0;
  }
  else {
    hVar4.m_ptr._5_1_ = in_stack_fffffffffffffefd;
    hVar4.m_ptr._0_5_ = in_stack_fffffffffffffef8;
    hVar4.m_ptr._6_1_ = in_stack_fffffffffffffefe;
    hVar4.m_ptr._7_1_ = in_stack_fffffffffffffeff;
    reinterpret_borrow<pybind11::sequence>(hVar4);
    std::vector<NodePosition,_std::allocator<NodePosition>_>::clear
              ((vector<NodePosition,_std::allocator<NodePosition>_> *)0x34aed6);
    sequence::sequence((sequence *)in_stack_fffffffffffffef0.m_ptr,
                       (sequence *)in_stack_fffffffffffffee8);
    reserve_maybe<std::vector<NodePosition,_std::allocator<NodePosition>_>,_0>
              (in_stack_ffffffffffffff00,
               (sequence *)
               CONCAT17(in_stack_fffffffffffffeff,
                        CONCAT16(in_stack_fffffffffffffefe,
                                 CONCAT15(in_stack_fffffffffffffefd,in_stack_fffffffffffffef8))),
               (vector<NodePosition,_std::allocator<NodePosition>_> *)
               in_stack_fffffffffffffef0.m_ptr);
    sequence::~sequence((sequence *)0x34af0e);
    sequence::begin((sequence *)in_stack_fffffffffffffef0.m_ptr);
    sVar3 = (sequence_slow_readwrite)sequence::end((sequence *)in_stack_fffffffffffffef0.m_ptr);
    while( true ) {
      hVar4.m_ptr = (PyObject *)sVar3.index;
      local_f8 = sVar3.obj.m_ptr;
      uVar2 = detail::operator!=((It *)in_stack_fffffffffffffef0.m_ptr,in_stack_fffffffffffffee8);
      if (!(bool)uVar2) break;
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator*
                (in_stack_fffffffffffffee8);
      type_caster<NodePosition,_void>::type_caster((type_caster<NodePosition,_void> *)0x34afca);
      accessor::operator_cast_to_object
                ((accessor<pybind11::detail::accessor_policies::sequence_item> *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffefe,
                                         CONCAT15(in_stack_fffffffffffffefd,
                                                  in_stack_fffffffffffffef8))));
      in_stack_fffffffffffffefe =
           type_caster_generic::load
                     ((type_caster_generic *)
                      CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffefe,
                                              CONCAT15(in_stack_fffffffffffffefd,
                                                       in_stack_fffffffffffffef8))),hVar4,
                      SUB81((ulong)in_stack_fffffffffffffef0.m_ptr >> 0x38,0));
      in_stack_fffffffffffffefd = in_stack_fffffffffffffefe ^ 0xff;
      object::~object((object *)0x34b01b);
      bVar1 = (in_stack_fffffffffffffefd & 1) != 0;
      if (bVar1) {
        local_1 = 0;
      }
      else {
        in_stack_fffffffffffffee8 = in_RDI;
        in_stack_fffffffffffffef0.m_ptr =
             (PyObject *)cast_op<NodePosition&&>((make_caster<NodePosition_&&> *)0x34b0c5);
        std::vector<NodePosition,_std::allocator<NodePosition>_>::push_back
                  ((vector<NodePosition,_std::allocator<NodePosition>_> *)hVar4.m_ptr,
                   (value_type *)
                   CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffefe,
                                           CONCAT15(in_stack_fffffffffffffefd,
                                                    in_stack_fffffffffffffef8))));
      }
      accessor<pybind11::detail::accessor_policies::sequence_item>::~accessor
                ((accessor<pybind11::detail::accessor_policies::sequence_item> *)0x34b0ee);
      if (bVar1) goto LAB_0034b12a;
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator++
                ((generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 in_stack_fffffffffffffef0.m_ptr);
      sVar3.index = (ssize_t)hVar4.m_ptr;
      sVar3.obj.m_ptr = local_f8.m_ptr;
    }
    local_1 = 1;
LAB_0034b12a:
    sequence::~sequence((sequence *)0x34b137);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }